

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

uint mp_coprime(mp_int *a,mp_int *b)

{
  mp_int *gcd;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  BignumInt BVar4;
  ulong uVar5;
  
  uVar3 = b->nw;
  if (a->nw < b->nw) {
    uVar3 = a->nw;
  }
  gcd = mp_make_sized(uVar3);
  uVar5 = 0;
  mp_gcd_into(a,b,gcd,(mp_int *)0x0,(mp_int *)0x0);
  uVar3 = gcd->nw;
  uVar2 = 1;
  uVar1 = 0;
  do {
    if (uVar1 < uVar3) {
      BVar4 = gcd->w[uVar1];
    }
    else {
      BVar4 = 0;
    }
    uVar5 = uVar5 | BVar4 ^ uVar2;
    uVar1 = uVar1 + 1;
    uVar2 = 0;
  } while (uVar3 + (uVar3 == 0) != uVar1);
  mp_free(gcd);
  return (uint)((uVar5 & 1) == 0 && uVar5 >> 1 == 0);
}

Assistant:

unsigned mp_coprime(mp_int *a, mp_int *b)
{
    mp_int *gcd = mp_gcd(a, b);
    unsigned toret = mp_eq_integer(gcd, 1);
    mp_free(gcd);
    return toret;
}